

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O2

int qEnvironmentVariableIntValue(char *varName,bool *ok)

{
  long lVar1;
  longlong *plVar2;
  longlong lVar3;
  long in_FS_OFFSET;
  optional<long_long> oVar4;
  int local_34;
  _Storage<long_long,_true> local_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  oVar4 = qEnvironmentVariableIntegerValue(varName);
  local_30._M_value =
       oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_28._0_1_ =
       oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_engaged;
  if (((undefined1  [16])
       oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    plVar2 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_30);
    lVar1 = *plVar2;
    plVar2 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_30);
    if ((lVar1 != (int)*plVar2) && ((char)local_28 == '\x01')) {
      local_28._0_1_ = false;
    }
  }
  if (ok != (bool *)0x0) {
    *ok = (bool)(char)local_28;
  }
  local_34 = 0;
  lVar3 = std::optional<long_long>::value_or<int>((optional<long_long> *)&local_30,&local_34);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)lVar3;
  }
  __stack_chk_fail();
}

Assistant:

int qEnvironmentVariableIntValue(const char *varName, bool *ok) noexcept
{
    std::optional<qint64> value = qEnvironmentVariableIntegerValue(varName);
    if (value && *value != int(*value))
        value = std::nullopt;
    if (ok)
        *ok = bool(value);
    return value.value_or(0);
}